

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::wordVectors(FastText *this)

{
  istream *piVar1;
  ostream *poVar2;
  Vector vec;
  string word;
  Vector local_60;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  Vector::Vector(&local_60,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  while( true ) {
    piVar1 = std::operator>>((istream *)&std::cin,(string *)&local_50);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    getVector(this,&local_60,&local_50);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = operator<<(poVar2,&local_60);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  Vector::~Vector(&local_60);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void FastText::wordVectors() {
  std::string word;
  Vector vec(args_->dim);
  while (std::cin >> word) {
    getVector(vec, word);
    std::cout << word << " " << vec << std::endl;
  }
}